

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

int asl::local8toUtf32(char *u,int *p,int n)

{
  int *piVar1;
  long lVar2;
  
  lVar2 = 0;
  piVar1 = p;
  do {
    if (u[lVar2] == '\0') break;
    *piVar1 = (int)u[lVar2];
    piVar1 = piVar1 + 1;
    lVar2 = lVar2 + 1;
  } while (n != (int)lVar2);
  *piVar1 = 0;
  return (int)((ulong)((long)piVar1 - (long)p) >> 2);
}

Assistant:

int local8toUtf32(const char* u, int* p, int n)
{
	const int* p0 = p;
	while (int c = *u++)
	{
		*p++ = c;
		if (--n == 0)
			break;
	}
	*p = 0;
	return int(p - p0);
}